

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_node::remove_attribute(xml_node *this,xml_attribute *a)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *ptr;
  xml_attribute_struct *pxVar2;
  xml_allocator *this_00;
  ulong uVar3;
  char_t *pcVar4;
  xml_attribute_struct *pxVar5;
  xml_attribute_struct *pxVar6;
  xml_attribute_struct **ppxVar7;
  size_t sVar8;
  
  pxVar1 = this->_root;
  ptr = a->_attr;
  pxVar2 = ptr;
  if (ptr != (xml_attribute_struct *)0x0 && pxVar1 != (xml_node_struct *)0x0) {
    do {
      pxVar5 = pxVar2;
      pxVar2 = pxVar5->prev_attribute_c;
    } while (pxVar2->next_attribute != (xml_attribute_struct *)0x0);
    if (pxVar5 == pxVar1->first_attribute) {
      pxVar2 = ptr->prev_attribute_c;
      pxVar5 = ptr->next_attribute;
      pxVar6 = pxVar1->first_attribute;
      if (pxVar5 != (xml_attribute_struct *)0x0) {
        pxVar6 = pxVar5;
      }
      pxVar6->prev_attribute_c = pxVar2;
      ppxVar7 = &pxVar2->next_attribute;
      if (pxVar2->next_attribute == (xml_attribute_struct *)0x0) {
        ppxVar7 = &pxVar1->first_attribute;
      }
      *ppxVar7 = pxVar5;
      this_00 = *(xml_allocator **)(pxVar1->header & 0xffffffffffffffe0);
      uVar3 = ptr->header;
      if ((uVar3 & 0x10) != 0) {
        pcVar4 = ptr->name;
        sVar8 = (size_t)*(ushort *)(pcVar4 + -2);
        if (sVar8 == 0) {
          sVar8 = *(size_t *)(pcVar4 + (-0x14 - (ulong)*(ushort *)(pcVar4 + -4)));
        }
        impl::anon_unknown_0::xml_allocator::deallocate_memory
                  (this_00,pcVar4 + -4,sVar8,
                   (xml_memory_page *)(pcVar4 + (-0x34 - (ulong)*(ushort *)(pcVar4 + -4))));
      }
      if ((uVar3 & 8) != 0) {
        pcVar4 = ptr->value;
        sVar8 = (size_t)*(ushort *)(pcVar4 + -2);
        if (sVar8 == 0) {
          sVar8 = *(size_t *)(pcVar4 + (-0x14 - (ulong)*(ushort *)(pcVar4 + -4)));
        }
        impl::anon_unknown_0::xml_allocator::deallocate_memory
                  (this_00,pcVar4 + -4,sVar8,
                   (xml_memory_page *)(pcVar4 + (-0x34 - (ulong)*(ushort *)(pcVar4 + -4))));
      }
      impl::anon_unknown_0::xml_allocator::deallocate_memory
                (this_00,ptr,0x28,(xml_memory_page *)(uVar3 & 0xffffffffffffffe0));
      return true;
    }
  }
  return false;
}

Assistant:

PUGI__FN bool xml_node::remove_attribute(const xml_attribute& a)
	{
		if (!_root || !a._attr) return false;

		// check that attribute belongs to *this
		xml_attribute_struct* attr = a._attr;

		while (attr->prev_attribute_c->next_attribute) attr = attr->prev_attribute_c;

		if (attr != _root->first_attribute) return false;

		if (a._attr->next_attribute) a._attr->next_attribute->prev_attribute_c = a._attr->prev_attribute_c;
		else if (_root->first_attribute) _root->first_attribute->prev_attribute_c = a._attr->prev_attribute_c;
		
		if (a._attr->prev_attribute_c->next_attribute) a._attr->prev_attribute_c->next_attribute = a._attr->next_attribute;
		else _root->first_attribute = a._attr->next_attribute;

		impl::destroy_attribute(a._attr, impl::get_allocator(_root));

		return true;
	}